

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_debug.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateMemberName(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  Op OVar1;
  uint32_t id;
  DiagnosticStream *pDVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar3;
  string local_448;
  string local_428;
  DiagnosticStream local_408;
  uint local_230;
  uint local_22c;
  uint32_t member_count;
  uint member_id;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *type;
  Instruction *pIStack_20;
  uint type_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  type._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,type._4_4_);
  if ((local_30 != (Instruction *)0x0) &&
     (OVar1 = Instruction::opcode(local_30), OVar1 == OpTypeStruct)) {
    local_22c = Instruction::GetOperandAs<unsigned_int>(pIStack_20,1);
    this_00 = Instruction::words(local_30);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
    local_230 = (int)sVar3 - 2;
    if (local_230 <= local_22c) {
      ValidationState_t::diag
                (&local_408,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar2 = DiagnosticStream::operator<<(&local_408,(char (*) [26])"OpMemberName Member <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_428,(ValidationState_t *)inst_local,local_22c);
      pDVar2 = DiagnosticStream::operator<<(pDVar2,&local_428);
      pDVar2 = DiagnosticStream::operator<<
                         (pDVar2,(char (*) [33])" index is larger than Type <id> ");
      this = inst_local;
      id = Instruction::id(local_30);
      ValidationState_t::getIdName_abi_cxx11_(&local_448,(ValidationState_t *)this,id);
      pDVar2 = DiagnosticStream::operator<<(pDVar2,&local_448);
      pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [16])"s member count.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_428);
      DiagnosticStream::~DiagnosticStream(&local_408);
      return __local._4_4_;
    }
    return SPV_SUCCESS;
  }
  ValidationState_t::diag
            (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
  pDVar2 = DiagnosticStream::operator<<(&local_208,(char (*) [24])"OpMemberName Type <id> ");
  ValidationState_t::getIdName_abi_cxx11_
            ((string *)&member_count,(ValidationState_t *)inst_local,type._4_4_);
  pDVar2 = DiagnosticStream::operator<<
                     (pDVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &member_count);
  pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [23])" is not a struct type.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
  std::__cxx11::string::~string((string *)&member_count);
  DiagnosticStream::~DiagnosticStream(&local_208);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateMemberName(ValidationState_t& _, const Instruction* inst) {
  const auto type_id = inst->GetOperandAs<uint32_t>(0);
  const auto type = _.FindDef(type_id);
  if (!type || spv::Op::OpTypeStruct != type->opcode()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpMemberName Type <id> " << _.getIdName(type_id)
           << " is not a struct type.";
  }
  const auto member_id = inst->GetOperandAs<uint32_t>(1);
  const auto member_count = (uint32_t)(type->words().size() - 2);
  if (member_count <= member_id) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpMemberName Member <id> " << _.getIdName(member_id)
           << " index is larger than Type <id> " << _.getIdName(type->id())
           << "s member count.";
  }
  return SPV_SUCCESS;
}